

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path.c
# Opt level: O1

size_t portability_path_get_fullname(char *path,size_t path_size,char *name,size_t name_size)

{
  ulong uVar1;
  char cVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (name != (char *)0x0 && path != (char *)0x0) {
    cVar2 = *path;
    if ((name_size == 0 || path_size == 0) || cVar2 == '\0') {
      uVar1 = 0;
    }
    else {
      uVar4 = 1;
      uVar1 = 0;
      do {
        name[uVar1] = cVar2;
        uVar3 = uVar1 + 1;
        uVar1 = 0;
        if (path[uVar4 - 1] != '/') {
          uVar1 = uVar3;
        }
      } while (((uVar4 < path_size) && (cVar2 = path[uVar4], cVar2 != '\0')) &&
              (uVar4 = uVar4 + 1, uVar1 < name_size));
    }
    name[uVar1] = '\0';
    return uVar1 + 1;
  }
  return 0;
}

Assistant:

size_t portability_path_get_fullname(const char *path, size_t path_size, char *name, size_t name_size)
{
	if (path == NULL || name == NULL)
	{
		return 0;
	}

	size_t i, count;

	for (i = 0, count = 0; path[i] != '\0' && i < path_size && count < name_size; ++i)
	{
		name[count++] = path[i];

		if (PORTABILITY_PATH_SEPARATOR(path[i]))
		{
			count = 0;
		}
	}

	name[count] = '\0';

	return count + 1;
}